

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR xpath_normalize_space(lyxp_set **args,uint32_t arg_count,lyxp_set *set,uint32_t options)

{
  undefined1 uVar1;
  ly_ctx *ctx;
  bool bVar2;
  bool bVar3;
  ly_bool lVar4;
  lysc_node *plVar5;
  char *pcVar6;
  size_t __size;
  void *ptr;
  lyxp_set_node *plVar7;
  LY_ERR ret__;
  LY_ERR rc;
  lysc_node_leaf *sleaf;
  ly_bool space_before;
  ly_bool have_spaces;
  char *new;
  uint local_30;
  uint32_t new_used;
  uint32_t i;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t arg_count_local;
  lyxp_set **args_local;
  
  bVar3 = false;
  bVar2 = false;
  if ((options & 0x1c) == 0) {
    if (arg_count != 0) {
      set_fill_set(set,*args);
    }
    args_local._4_4_ = lyxp_set_cast(set,LYXP_SET_STRING);
    if (args_local._4_4_ == LY_SUCCESS) {
      for (local_30 = 0; *(char *)((long)&((set->val).nodes)->node + (ulong)local_30) != '\0';
          local_30 = local_30 + 1) {
        if ((((*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == ' ') ||
             (*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == '\t')) ||
            (*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == '\n')) ||
           (*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == '\r')) {
          if (((local_30 == 0) || (bVar2)) ||
             (*(char *)((long)&((set->val).nodes)->node + (ulong)(local_30 + 1)) == '\0')) {
            bVar3 = true;
            break;
          }
          bVar2 = true;
        }
        else {
          bVar2 = false;
        }
      }
      if (bVar3) {
        __size = strlen((set->val).str);
        ptr = malloc(__size);
        if (ptr == (void *)0x0) {
          ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xpath_normalize_space");
          return LY_EMEM;
        }
        new._4_4_ = 0;
        bVar2 = false;
        for (local_30 = 0; *(char *)((long)&((set->val).nodes)->node + (ulong)local_30) != '\0';
            local_30 = local_30 + 1) {
          if (((*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == ' ') ||
              (*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == '\t')) ||
             ((*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == '\n' ||
              (*(char *)((long)&((set->val).nodes)->node + (ulong)local_30) == '\r')))) {
            if ((local_30 != 0) && (!bVar2)) {
              bVar2 = true;
              goto LAB_0022761d;
            }
            bVar2 = true;
          }
          else {
            bVar2 = false;
LAB_0022761d:
            if (bVar2) {
              uVar1 = 0x20;
            }
            else {
              uVar1 = *(undefined1 *)((long)&((set->val).nodes)->node + (ulong)local_30);
            }
            *(undefined1 *)((long)ptr + (ulong)new._4_4_) = uVar1;
            new._4_4_ = new._4_4_ + 1;
          }
        }
        if ((new._4_4_ != 0) &&
           ((((*(char *)((long)ptr + (ulong)(new._4_4_ - 1)) == ' ' ||
              (*(char *)((long)ptr + (ulong)(new._4_4_ - 1)) == '\t')) ||
             (*(char *)((long)ptr + (ulong)(new._4_4_ - 1)) == '\n')) ||
            (*(char *)((long)ptr + (ulong)(new._4_4_ - 1)) == '\r')))) {
          new._4_4_ = new._4_4_ - 1;
        }
        plVar7 = (lyxp_set_node *)ly_realloc(ptr,(ulong)(new._4_4_ + 1));
        if (plVar7 == (lyxp_set_node *)0x0) {
          ly_log(set->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                 "xpath_normalize_space");
          return LY_EMEM;
        }
        *(undefined1 *)((long)&plVar7->node + (ulong)new._4_4_) = 0;
        free((set->val).nodes);
        (set->val).nodes = plVar7;
      }
      args_local._4_4_ = LY_SUCCESS;
    }
  }
  else {
    if (((arg_count != 0) && ((*args)->type == LYXP_SET_SCNODE_SET)) &&
       (plVar5 = warn_get_scnode_in_ctx(*args), plVar5 != (lysc_node *)0x0)) {
      if ((plVar5->nodetype & 0xc) == 0) {
        ctx = set->ctx;
        pcVar6 = lys_nodetype2str(plVar5->nodetype);
        ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Argument #1 of %s is a %s node \"%s\".",
               "xpath_normalize_space",pcVar6,plVar5->name);
      }
      else {
        lVar4 = warn_is_string_type((lysc_type *)plVar5[1].parent);
        if (lVar4 == '\0') {
          ly_log(set->ctx,LY_LLWRN,LY_SUCCESS,
                 "Argument #1 of %s is node \"%s\", not of string-type.","xpath_normalize_space",
                 plVar5->name);
        }
      }
    }
    set_scnode_clear_ctx(set,1);
    args_local._4_4_ = LY_SUCCESS;
  }
  return args_local._4_4_;
}

Assistant:

static LY_ERR
xpath_normalize_space(struct lyxp_set **args, uint32_t arg_count, struct lyxp_set *set, uint32_t options)
{
    uint32_t i, new_used;
    char *new;
    ly_bool have_spaces = 0, space_before = 0;
    struct lysc_node_leaf *sleaf;
    LY_ERR rc = LY_SUCCESS;

    if (options & LYXP_SCNODE_ALL) {
        if (arg_count && (args[0]->type == LYXP_SET_SCNODE_SET) &&
                (sleaf = (struct lysc_node_leaf *)warn_get_scnode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(set->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, lys_nodetype2str(sleaf->nodetype),
                        sleaf->name);
            } else if (!warn_is_string_type(sleaf->type)) {
                LOGWRN(set->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
            }
        }
        set_scnode_clear_ctx(set, LYXP_SET_SCNODE_ATOM_VAL);
        return rc;
    }

    if (arg_count) {
        set_fill_set(set, args[0]);
    }
    rc = lyxp_set_cast(set, LYXP_SET_STRING);
    LY_CHECK_RET(rc);

    /* is there any normalization necessary? */
    for (i = 0; set->val.str[i]; ++i) {
        if (is_xmlws(set->val.str[i])) {
            if ((i == 0) || space_before || (!set->val.str[i + 1])) {
                have_spaces = 1;
                break;
            }
            space_before = 1;
        } else {
            space_before = 0;
        }
    }

    /* yep, there is */
    if (have_spaces) {
        /* it's enough, at least one character will go, makes space for ending '\0' */
        new = malloc(strlen(set->val.str) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new_used = 0;

        space_before = 0;
        for (i = 0; set->val.str[i]; ++i) {
            if (is_xmlws(set->val.str[i])) {
                if ((i == 0) || space_before) {
                    space_before = 1;
                    continue;
                } else {
                    space_before = 1;
                }
            } else {
                space_before = 0;
            }

            new[new_used] = (space_before ? ' ' : set->val.str[i]);
            ++new_used;
        }

        /* at worst there is one trailing space now */
        if (new_used && is_xmlws(new[new_used - 1])) {
            --new_used;
        }

        new = ly_realloc(new, (new_used + 1) * sizeof(char));
        LY_CHECK_ERR_RET(!new, LOGMEM(set->ctx), LY_EMEM);
        new[new_used] = '\0';

        free(set->val.str);
        set->val.str = new;
    }

    return LY_SUCCESS;
}